

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.h
# Opt level: O0

EExpr * __thiscall mp::BucketAccumulator<mp::EExpr>::ExtractSum(BucketAccumulator<mp::EExpr> *this)

{
  QuadTerms *in_RDI;
  double in_stack_000001a8;
  QuadTerms *in_stack_000001b0;
  LinTerms *in_stack_000001b8;
  EExpr *in_stack_000001c0;
  BucketAccum1Type<mp::QuadTerms> *in_stack_00000228;
  QuadTerms *this_00;
  BucketAccum1Type<mp::LinTerms> *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  BucketAccum1Type<mp::LinTerms>::ExtractSum(in_stack_ffffffffffffffd8);
  BucketAccum1Type<mp::QuadTerms>::ExtractSum(in_stack_00000228);
  EExpr::EExpr(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001a8);
  QuadTerms::~QuadTerms(this_00);
  LinTerms::~LinTerms((LinTerms *)this_00);
  return (EExpr *)in_RDI;
}

Assistant:

EExprLike ExtractSum() {
    return EExprLike
        {ba_l_.ExtractSum(), ba_q_.ExtractSum(), ct_};
  }